

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder2.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  int doors;
  int rooms;
  MazeGame game;
  CountingMazeBuilder builder;
  int local_38;
  int local_34;
  undefined **local_30;
  CountingMazeBuilder local_28 [16];
  
  local_30 = &PTR_MakeMaze_00103d58;
  CountingMazeBuilder::CountingMazeBuilder(local_28);
  MazeGame::CreateMaze((MazeBuilder *)&local_30);
  CountingMazeBuilder::GetCounts((int *)local_28,&local_34);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"The maze has ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_34);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," rooms and ",0xb);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," doors",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
  int rooms, doors;
  MazeGame game;
  CountingMazeBuilder builder;
  
  game.CreateMaze(builder);
  builder.GetCounts(rooms, doors);
  
  cout << "The maze has "
       << rooms << " rooms and "
       << doors << " doors" << endl;
}